

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matchit.h
# Opt level: O0

void __thiscall
matchit::impl::IdBlockBase<mathiu::impl::List>::reset
          (IdBlockBase<mathiu::impl::List> *this,int32_t depth)

{
  variant<std::monostate,_mathiu::impl::List,_mathiu::impl::List_*,_const_mathiu::impl::List_*>
  local_38;
  int32_t local_14;
  IdBlockBase<mathiu::impl::List> *pIStack_10;
  int32_t depth_local;
  IdBlockBase<mathiu::impl::List> *this_local;
  
  if (-1 < this->mDepth - depth) {
    local_14 = depth;
    pIStack_10 = this;
    memset(&local_38,0,0x20);
    std::
    variant<std::monostate,_mathiu::impl::List,_mathiu::impl::List_*,_const_mathiu::impl::List_*>::
    variant(&local_38);
    std::
    variant<std::monostate,_mathiu::impl::List,_mathiu::impl::List_*,_const_mathiu::impl::List_*>::
    operator=(&this->mVariant,&local_38);
    std::
    variant<std::monostate,_mathiu::impl::List,_mathiu::impl::List_*,_const_mathiu::impl::List_*>::
    ~variant(&local_38);
    this->mDepth = local_14;
  }
  return;
}

Assistant:

constexpr void reset(int32_t depth)
            {
                if (mDepth - depth >= 0)
                {
                    mVariant = {};
                    mDepth = depth;
                }
            }